

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameterio.cpp
# Opt level: O2

int ReadF0(char *filename,double *temporal_positions,double *f0)

{
  int iVar1;
  FILE *__stream;
  ulong uVar2;
  ulong uVar3;
  int number_of_frames;
  char data_check [5];
  double frame_period;
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    puts("File cannot be opened.");
  }
  else {
    iVar1 = anon_unknown.dwarf_b3fd::CheckHeader((FILE *)__stream,"F0  ");
    if (iVar1 != 0) {
      fread(data_check,1,4,__stream);
      fread(&number_of_frames,4,1,__stream);
      fread(data_check,1,4,__stream);
      fread(&frame_period,8,1,__stream);
      fread(f0,8,(long)number_of_frames,__stream);
      fclose(__stream);
      uVar2 = 0;
      uVar3 = 0;
      if (0 < number_of_frames) {
        uVar3 = (ulong)(uint)number_of_frames;
      }
      for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
        temporal_positions[uVar2] = ((double)(int)uVar2 / 1000.0) * frame_period;
      }
      return 1;
    }
  }
  return 0;
}

Assistant:

int ReadF0(const char *filename, double *temporal_positions, double *f0) {
  FILE *fp = fopen(filename, "rb");
  if (NULL == fp) {
    printf("File cannot be opened.\n");
    return 0;
  }

  // Header
  if (CheckHeader(fp, "F0  ") == 0) return 0;

  // Parameters
  char data_check[5];
  fread(data_check, 1, 4, fp);  // "NOF "
  int number_of_frames;
  fread(&number_of_frames, 4, 1, fp);

  fread(data_check, 1, 4, fp);  // "FP  "
  double frame_period;
  fread(&frame_period, 8, 1, fp);

  // Data
  fread(f0, 8, number_of_frames, fp);

  fclose(fp);
  for (int i = 0; i < number_of_frames; ++i)
    temporal_positions[i] = i / 1000.0 * frame_period;
  return 1;
}